

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O3

void toml::detail::skip_array_like<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  size_t *psVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  element_type *peVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  element_type *peVar9;
  location checkpoint;
  sequence local_188;
  location local_168;
  sequence local_120;
  region local_100;
  region local_98;
  
  psVar1 = &loc->location_;
  peVar9 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar3 = loc->location_;
  lVar6 = (long)(peVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar4 = (long)(peVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - lVar6;
  if (uVar3 + 1 < uVar4) {
    if (*(char *)(lVar6 + uVar3) == '\n') {
      loc->line_number_ = loc->line_number_ + 1;
      sVar7 = 1;
    }
    else {
      sVar7 = loc->column_number_ + 1;
    }
    loc->column_number_ = sVar7;
    uVar3 = uVar3 + 1;
  }
  else if (uVar4 != uVar3) {
    sVar7 = loc->line_number_;
    sVar8 = loc->column_number_;
    do {
      if (*(char *)(lVar6 + uVar3) == '\n') {
        sVar7 = sVar7 + 1;
        loc->line_number_ = sVar7;
        sVar8 = 1;
      }
      else {
        sVar8 = sVar8 + 1;
      }
      loc->column_number_ = sVar8;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
    *psVar1 = uVar4;
    return;
  }
  *psVar1 = uVar3;
  if (uVar4 <= uVar3) {
    return;
  }
  do {
    bVar2 = *(byte *)(lVar6 + uVar3);
    if (bVar2 < 0x3d) {
      if (bVar2 != 0x22) {
        if (bVar2 == 0x23) {
          skip_comment_block<toml::type_config>(loc,ctx);
          goto LAB_003d197e;
        }
        if (bVar2 != 0x27) goto LAB_003d19b2;
      }
      skip_string_like<toml::type_config>(loc,ctx);
    }
    else if (bVar2 < 0x5d) {
      if (bVar2 == 0x5b) {
        location::location(&local_168,loc);
        syntax::std_table(&local_188,&ctx->toml_spec_);
        sequence::scan(&local_100,&local_188,loc);
        if (local_100.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)0x0) {
          region::~region(&local_100);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector(&local_188.others_);
LAB_003d1b01:
          (loc->source_).
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_168.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &(loc->source_).
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_168.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &loc->source_name_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &local_168.source_name_);
          loc->column_number_ = local_168.column_number_;
          *psVar1 = local_168.location_;
          loc->line_number_ = local_168.line_number_;
          location::~location(&local_168);
          return;
        }
        syntax::array_table(&local_120,&ctx->toml_spec_);
        sequence::scan(&local_98,&local_120,loc);
        peVar9 = local_98.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        region::~region(&local_98);
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector(&local_120.others_);
        region::~region(&local_100);
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector(&local_188.others_);
        if (peVar9 != (element_type *)0x0) goto LAB_003d1b01;
        skip_array_like<toml::type_config>(loc,ctx);
        location::~location(&local_168);
      }
      else {
        if (bVar2 == 0x3d) {
          if (uVar3 == 0) {
            return;
          }
          peVar5 = (element_type *)
                   (peVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          while( true ) {
            uVar4 = uVar3 - 1;
            *psVar1 = uVar4;
            if (*(char *)((long)peVar5 + (uVar3 - 1)) == '\n') {
              loc->line_number_ = loc->line_number_ - 1;
              peVar9 = (element_type *)((long)peVar5 + (uVar3 - 1));
              local_188.super_scanner_base._vptr_scanner_base._0_1_ = 10;
              local_100.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar9;
              local_98.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar5;
              std::
              __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                        (&local_168,&local_100,&local_98,&local_188);
              loc->column_number_ =
                   (long)peVar9 +
                   (1 - (long)local_168.source_.
                              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
              peVar9 = (loc->source_).
                       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              uVar4 = loc->location_;
              peVar5 = (element_type *)
                       (peVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start;
            }
            if ((uVar4 < (ulong)((long)(peVar9->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)peVar5))
               && (*(char *)((long)&(peVar5->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar4) == '\n'))
            break;
            uVar3 = uVar4;
            if (uVar4 == 0) {
              return;
            }
          }
          location::advance(loc,1);
          return;
        }
LAB_003d19b2:
        if (uVar3 + 1 < uVar4) {
          if (bVar2 == 10) {
            loc->line_number_ = loc->line_number_ + 1;
            sVar7 = 1;
          }
          else {
            sVar7 = loc->column_number_ + 1;
          }
          loc->column_number_ = sVar7;
          uVar4 = uVar3 + 1;
        }
        else {
          sVar7 = loc->line_number_;
          sVar8 = loc->column_number_;
          do {
            if (*(char *)(lVar6 + uVar3) == '\n') {
              sVar7 = sVar7 + 1;
              loc->line_number_ = sVar7;
              sVar8 = 1;
            }
            else {
              sVar8 = sVar8 + 1;
            }
            loc->column_number_ = sVar8;
            uVar3 = uVar3 + 1;
          } while (uVar4 != uVar3);
        }
        *psVar1 = uVar4;
      }
    }
    else {
      if (bVar2 != 0x7b) {
        if (bVar2 == 0x5d) {
          return;
        }
        goto LAB_003d19b2;
      }
      skip_inline_table_like<toml::type_config>(loc,ctx);
    }
LAB_003d197e:
    peVar9 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar3 = loc->location_;
    lVar6 = (long)(peVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(peVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - lVar6;
    if (uVar4 <= uVar3) {
      return;
    }
  } while( true );
}

Assistant:

void skip_array_like(location& loc, const context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    assert(loc.current() == '[');
    loc.advance();

    while( ! loc.eof())
    {
        if(loc.current() == '\"' || loc.current() == '\'')
        {
            skip_string_like(loc, ctx);
        }
        else if(loc.current() == '#')
        {
            skip_comment_block(loc, ctx);
        }
        else if(loc.current() == '{')
        {
            skip_inline_table_like(loc, ctx);
        }
        else if(loc.current() == '[')
        {
            const auto checkpoint = loc;
            if(syntax::std_table(spec).scan(loc).is_ok() ||
               syntax::array_table(spec).scan(loc).is_ok())
            {
                loc = checkpoint;
                break;
            }
            // if it is not a table-definition, then it is an array.
            skip_array_like(loc, ctx);
        }
        else if(loc.current() == '=')
        {
            // key-value pair cannot be inside the array.
            // guessing the error is "missing closing bracket `]`".
            // find the previous key just before `=`.
            while(loc.get_location() != 0)
            {
                loc.retrace();
                if(loc.current() == '\n')
                {
                    loc.advance();
                    break;
                }
            }
            break;
        }
        else if(loc.current() == ']')
        {
            break; // found closing bracket
        }
        else
        {
            loc.advance();
        }
    }
    return ;
}